

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_genprime.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  ulong uVar4;
  char *pcVar5;
  size_t nbits;
  bool bVar6;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi G;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_mpi local_5d0;
  mbedtls_mpi local_5b8;
  mbedtls_mpi local_5a0;
  mbedtls_ctr_drbg_context local_588;
  mbedtls_entropy_context local_430;
  
  mbedtls_mpi_init(&local_5a0);
  mbedtls_mpi_init(&local_5b8);
  mbedtls_mpi_init(&local_5d0);
  mbedtls_ctr_drbg_init(&local_588);
  mbedtls_entropy_init(&local_430);
  if (argc == 0) {
LAB_00103399:
    printf(
          "\n usage: dh_genprime param=<>...\n\n acceprable parameters:\n    bits=%%d           default: 2048\n"
          );
    return 1;
  }
  nbits = 0x800;
  if (1 < argc) {
    uVar4 = 1;
    do {
      pcVar5 = argv[uVar4];
      pcVar3 = strchr(pcVar5,0x3d);
      if (pcVar3 == (char *)0x0) goto LAB_00103399;
      *pcVar3 = '\0';
      iVar1 = strcmp(pcVar5,"bits");
      if ((iVar1 != 0) || (uVar2 = atoi(pcVar3 + 1), 0x2000 < uVar2)) goto LAB_00103399;
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
    nbits = (size_t)uVar2;
  }
  uVar2 = mbedtls_mpi_read_string(&local_5a0,10,"4");
  if (uVar2 == 0) {
    puts("  ! Generating large primes may take minutes!");
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    uVar2 = mbedtls_ctr_drbg_seed
                      (&local_588,mbedtls_entropy_func,&local_430,(uchar *)"dh_genprime",0xb);
    if (uVar2 == 0) {
      printf(" ok\n  . Generating the modulus, please wait...");
      fflush(_stdout);
      uVar2 = mbedtls_mpi_gen_prime(&local_5b8,nbits,1,mbedtls_ctr_drbg_random,&local_588);
      if (uVar2 == 0) {
        printf(" ok\n  . Verifying that Q = (P-1)/2 is prime...");
        fflush(_stdout);
        uVar2 = mbedtls_mpi_sub_int(&local_5d0,&local_5b8,1);
        if (uVar2 == 0) {
          uVar2 = mbedtls_mpi_div_int(&local_5d0,(mbedtls_mpi *)0x0,&local_5d0,2);
          if (uVar2 == 0) {
            uVar2 = mbedtls_mpi_is_prime(&local_5d0,mbedtls_ctr_drbg_random,&local_588);
            if (uVar2 == 0) {
              printf(" ok\n  . Exporting the value in dh_prime.txt...");
              fflush(_stdout);
              __stream = fopen("dh_prime.txt","wb+");
              if (__stream == (FILE *)0x0) {
                puts(" failed\n  ! Could not create dh_prime.txt\n");
                uVar2 = 1;
                goto LAB_001034dd;
              }
              iVar1 = mbedtls_mpi_write_file("P = ",&local_5b8,0x10,(FILE *)__stream);
              bVar6 = iVar1 != 0;
              if (iVar1 == 0) {
                iVar1 = mbedtls_mpi_write_file("G = ",&local_5a0,0x10,(FILE *)__stream);
                bVar6 = iVar1 != 0;
                if (bVar6) goto LAB_001035b5;
                puts(" ok\n");
              }
              else {
LAB_001035b5:
                printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)bVar6);
              }
              uVar2 = (uint)bVar6;
              fclose(__stream);
              goto LAB_001034dd;
            }
            uVar4 = (ulong)uVar2;
            pcVar5 = " failed\n  ! mbedtls_mpi_is_prime returned %d\n\n";
          }
          else {
            uVar4 = (ulong)uVar2;
            pcVar5 = " failed\n  ! mbedtls_mpi_div_int returned %d\n\n";
          }
        }
        else {
          uVar4 = (ulong)uVar2;
          pcVar5 = " failed\n  ! mbedtls_mpi_sub_int returned %d\n\n";
        }
      }
      else {
        uVar4 = (ulong)uVar2;
        pcVar5 = " failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n";
      }
    }
    else {
      uVar4 = (ulong)uVar2;
      pcVar5 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
    }
  }
  else {
    uVar4 = (ulong)uVar2;
    pcVar5 = " failed\n  ! mbedtls_mpi_read_string returned %d\n";
  }
  uVar2 = (uint)uVar4;
  printf(pcVar5,uVar4);
LAB_001034dd:
  mbedtls_mpi_free(&local_5a0);
  mbedtls_mpi_free(&local_5b8);
  mbedtls_mpi_free(&local_5d0);
  mbedtls_ctr_drbg_free(&local_588);
  mbedtls_entropy_free(&local_430);
  return uVar2;
}

Assistant:

int main( int argc, char **argv )
{
    int ret = 1;
    mbedtls_mpi G, P, Q;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "dh_genprime";
    FILE *fout;
    int nbits = DFL_BITS;
    int i;
    char *p, *q;

    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        return( 1 );
    }

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "bits" ) == 0 )
        {
            nbits = atoi( q );
            if( nbits < 0 || nbits > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
        else
            goto usage;
    }

    if( ( ret = mbedtls_mpi_read_string( &G, 10, GENERATOR ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_string returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( "  ! Generating large primes may take minutes!\n" );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the modulus, please wait..." );
    fflush( stdout );

    /*
     * This can take a long time...
     */
    if( ( ret = mbedtls_mpi_gen_prime( &P, nbits, 1,
                               mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Verifying that Q = (P-1)/2 is prime..." );
    fflush( stdout );

    if( ( ret = mbedtls_mpi_sub_int( &Q, &P, 1 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_sub_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_div_int( &Q, NULL, &Q, 2 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_div_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_is_prime( &Q, mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_is_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the value in dh_prime.txt..." );
    fflush( stdout );

    if( ( fout = fopen( "dh_prime.txt", "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create dh_prime.txt\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "P = ", &P, 16, fout ) != 0 ) ||
        ( ret = mbedtls_mpi_write_file( "G = ", &G, 16, fout ) != 0 ) )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        fclose( fout );
        goto exit;
    }

    mbedtls_printf( " ok\n\n" );
    fclose( fout );

exit:

    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}